

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp.h
# Opt level: O2

double __thiscall iir_filter<3>::operator()(iir_filter<3> *this,double in)

{
  circular_buffer<double,_std::allocator<double>_> *pcVar1;
  double dVar2;
  double dVar3;
  double yvn;
  double local_60;
  double local_58;
  iterator<boost::circular_buffer<double,_std::allocator<double>_>,_boost::cb_details::nonconst_traits<std::allocator<double>_>_>
  local_50;
  iterator<boost::circular_buffer<double,_std::allocator<double>_>,_boost::cb_details::nonconst_traits<std::allocator<double>_>_>
  local_40;
  iterator<boost::circular_buffer<double,_std::allocator<double>_>,_boost::cb_details::nonconst_traits<std::allocator<double>_>_>
  local_30;
  iterator<boost::circular_buffer<double,_std::allocator<double>_>,_boost::cb_details::nonconst_traits<std::allocator<double>_>_>
  local_20;
  
  pcVar1 = &this->xv_m;
  local_58 = in;
  boost::circular_buffer<double,std::allocator<double>>::push_front_impl<double_const&>
            (pcVar1,&local_58);
  local_20.m_it = (pointer)(this->xv_m).m_size;
  if (local_20.m_it != (pointer)0x0) {
    local_20.m_it = (this->xv_m).m_first;
  }
  dVar2 = this->gain_m;
  local_30.m_it = (pointer)0x0;
  local_30.m_buff = pcVar1;
  local_20.m_buff = pcVar1;
  dVar3 = std::
          inner_product<boost::cb_details::iterator<boost::circular_buffer<double,std::allocator<double>>,boost::cb_details::nonconst_traits<std::allocator<double>>>,double*,double>
                    (&local_20,&local_30,(this->b_m)._M_elems,0.0);
  pcVar1 = &this->yv_m;
  local_40.m_it = (pointer)(this->yv_m).m_size;
  if (local_40.m_it != (pointer)0x0) {
    local_40.m_it = (this->yv_m).m_first;
  }
  local_50.m_it = (pointer)0x0;
  local_50.m_buff = pcVar1;
  local_40.m_buff = pcVar1;
  local_60 = std::
             inner_product<boost::cb_details::iterator<boost::circular_buffer<double,std::allocator<double>>,boost::cb_details::nonconst_traits<std::allocator<double>>>,double*,double>
                       (&local_40,&local_50,(this->a_m)._M_elems + 1,0.0);
  local_60 = dVar2 * dVar3 - local_60;
  boost::circular_buffer<double,std::allocator<double>>::push_front_impl<double_const&>
            (pcVar1,&local_60);
  return local_60;
}

Assistant:

double operator()(double in)
    {
        xv_m.push_front(in);
        double yvn =
            gain_m * std::inner_product(xv_m.begin(), xv_m.end(), b_m.begin(), 0.0) -
            std::inner_product(yv_m.begin(), yv_m.end(), a_m.begin() + 1, 0.0);
        yv_m.push_front(yvn);
        return yvn;
    }